

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

double __thiscall
ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform *this,ON_Xform *N_xform)

{
  double __x;
  int iVar1;
  long lVar2;
  ON_Xform *pOVar3;
  double *pdVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  double dVar7;
  double p;
  double I [4] [4];
  ON_Xform rotation;
  double local_1c0;
  double local_1b8;
  ON_3dVector local_1b0;
  ON_Xform local_198;
  ON_Xform local_118;
  ON_Xform local_98;
  
  bVar6 = 0;
  pdVar4 = (double *)N_xform;
  for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *(double *)this;
    this = (ON_Xform *)((long)this + 8);
    pdVar4 = pdVar4 + 1;
  }
  N_xform->m_xform[1][3] = 0.0;
  N_xform->m_xform[0][3] = 0.0;
  N_xform->m_xform[2][3] = 0.0;
  N_xform->m_xform[3][0] = 0.0;
  N_xform->m_xform[3][1] = 0.0;
  N_xform->m_xform[3][2] = 0.0;
  N_xform->m_xform[3][3] = 1.0;
  local_98.m_xform[0][0] = 0.0;
  local_198.m_xform[0][0] = 0.0;
  Inv((double *)N_xform,(double (*) [4])&local_118,(double *)&local_98,(double *)&local_198);
  __x = (double)(~-(ulong)(local_98.m_xform[0][0] != 0.0) & (ulong)local_98.m_xform[0][0] |
                (ulong)(1.0 / local_98.m_xform[0][0]) & -(ulong)(local_98.m_xform[0][0] != 0.0));
  dVar7 = ABS(__x);
  if (dVar7 <= 3.308722450213671e-24) {
    return 0.0;
  }
  if (1.0 <= dVar7 * 3.308722450213671e-24) {
    return 0.0;
  }
  if (dVar7 * 2.220446049250313e-16 < ABS(local_198.m_xform[0][0])) {
    pOVar3 = &Nan;
    pOVar5 = &local_98;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar5->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    iVar1 = DecomposeSimilarity(N_xform,&local_1b0,&local_1c0,&local_98,2.3283064365386963e-10);
    if (iVar1 == 0) {
      iVar1 = Inv((double *)N_xform,(double (*) [4])&local_118,(double *)&local_198,&local_1b8);
      pOVar3 = &local_118;
      pOVar5 = N_xform;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pOVar5->m_xform[0][0] = pOVar3->m_xform[0][0];
        pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      if (iVar1 != 4) {
        return 0.0;
      }
      N_xform->m_xform[1][3] = 0.0;
      N_xform->m_xform[0][3] = 0.0;
      N_xform->m_xform[3][1] = 0.0;
      N_xform->m_xform[3][2] = 0.0;
      N_xform->m_xform[2][3] = 0.0;
      N_xform->m_xform[3][0] = 0.0;
      N_xform->m_xform[3][3] = 1.0;
      Transpose(N_xform);
      if (ABS(dVar7 + -1.0) <= 1.490116119385e-08) {
        return __x;
      }
      dVar7 = pow(__x,-0.3333333333333333);
    }
    else {
      pOVar3 = &local_98;
      pOVar5 = N_xform;
      for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pOVar5->m_xform[0][0] = pOVar3->m_xform[0][0];
        pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      if (0.0 <= __x) {
        return __x;
      }
      dVar7 = -1.0;
    }
    ON_Xform(&local_198,dVar7);
    operator*(&local_118,&local_198,N_xform);
    pOVar3 = &local_118;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      N_xform->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      N_xform = (ON_Xform *)((long)N_xform + ((ulong)bVar6 * -2 + 1) * 8);
    }
    return __x;
  }
  return 0.0;
}

Assistant:

double ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform& N_xform) const
{
  N_xform = *this;
  N_xform.Linearize();
  double pivot = 0;
  double det = N_xform.Determinant(&pivot);

  double tol = ON_SQRT_EPSILON * ON_SQRT_EPSILON * ON_SQRT_EPSILON;
  if (fabs(det) <= tol || fabs(det) * tol >= 1.0 || fabs(pivot) <= ON_EPSILON * fabs(det))
    return 0.;

  ON_3dVector translation{ ON_3dVector::NanVector };
  double scale{ ON_DBL_QNAN };
  ON_Xform rotation{ ON_Xform::Nan };
  const int is_similarity = N_xform.DecomposeSimilarity(translation, scale, rotation, ON_ZERO_TOLERANCE);
  // If it's a uniform scale, handle it, otherwise need to get the inverse.
  if (is_similarity != 0)
  {
    N_xform = rotation;
    if (det < 0)
    {
      N_xform = ON_Xform(-1.) * N_xform;
    }
    return det;
  }

  if (!N_xform.Invert()) return 0.;
  N_xform.Linearize();
  N_xform.Transpose();
  if (abs(abs(det) - 1) > ON_SQRT_EPSILON)
  {
    N_xform = ON_Xform(pow(det, -1. / 3.)) * N_xform;
  }

  return det;
}